

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef kfold_xload(jit_State *J,IRIns *ir,void *p)

{
  TRef TVar1;
  ulong u64;
  undefined8 in_RDX;
  jit_State *in_RSI;
  int32_t k;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  u64 = (ulong)(((in_RSI->cur).marked & 0x1f) - 0xe);
  switch(u64) {
  case 0:
    TVar1 = lj_ir_knum_u64((jit_State *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),u64);
    return TVar1;
  case 1:
    break;
  case 2:
    break;
  case 3:
    break;
  case 4:
    break;
  case 5:
  case 6:
    break;
  case 7:
  case 8:
    TVar1 = lj_ir_kint64((jit_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         u64);
    return TVar1;
  default:
    return 0;
  }
  TVar1 = lj_ir_kint(in_RSI,(int32_t)((ulong)in_RDX >> 0x20));
  return TVar1;
}

Assistant:

static TRef kfold_xload(jit_State *J, IRIns *ir, const void *p)
{
  int32_t k;
  switch (irt_type(ir->t)) {
  case IRT_NUM: return lj_ir_knum_u64(J, *(uint64_t *)p);
  case IRT_I8: k = (int32_t)*(int8_t *)p; break;
  case IRT_U8: k = (int32_t)*(uint8_t *)p; break;
  case IRT_I16: k = (int32_t)(int16_t)lj_getu16(p); break;
  case IRT_U16: k = (int32_t)(uint16_t)lj_getu16(p); break;
  case IRT_INT: case IRT_U32: k = (int32_t)lj_getu32(p); break;
  case IRT_I64: case IRT_U64: return lj_ir_kint64(J, *(uint64_t *)p);
  default: return 0;
  }
  return lj_ir_kint(J, k);
}